

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::maketetrahedron(tetgenmesh *this,triface *newtet)

{
  tetrahedron *pppdVar1;
  
  pppdVar1 = (tetrahedron *)memorypool::alloc(this->tetrahedrons);
  newtet->tet = pppdVar1;
  *pppdVar1 = (tetrahedron)0x0;
  newtet->tet[1] = (tetrahedron)0x0;
  newtet->tet[2] = (tetrahedron)0x0;
  newtet->tet[3] = (tetrahedron)0x0;
  newtet->tet[4] = (tetrahedron)0x0;
  newtet->tet[5] = (tetrahedron)0x0;
  newtet->tet[6] = (tetrahedron)0x0;
  newtet->tet[7] = (tetrahedron)0x0;
  newtet->tet[8] = (tetrahedron)0x0;
  newtet->tet[9] = (tetrahedron)0x0;
  pppdVar1 = newtet->tet;
  *(undefined4 *)((long)pppdVar1 + (long)this->elemmarkerindex * 4) = 0;
  if (0 < (long)this->numelemattrib) {
    memset(pppdVar1 + this->elemattribindex,0,(long)this->numelemattrib << 3);
  }
  if (this->b->varvolume != 0) {
    pppdVar1[this->volumeboundindex] = (tetrahedron)0xbff0000000000000;
  }
  newtet->ver = 0xb;
  return;
}

Assistant:

void tetgenmesh::maketetrahedron(triface *newtet)
{
  newtet->tet = (tetrahedron *) tetrahedrons->alloc();

  // Initialize the four adjoining tetrahedra to be "outer space".
  newtet->tet[0] = NULL;
  newtet->tet[1] = NULL;
  newtet->tet[2] = NULL;
  newtet->tet[3] = NULL;
  // Four NULL vertices.
  newtet->tet[4] = NULL;
  newtet->tet[5] = NULL;
  newtet->tet[6] = NULL;
  newtet->tet[7] = NULL;
  // No attached segments and subfaces yet.
  newtet->tet[8] = NULL; 
  newtet->tet[9] = NULL; 
  // Initialize the marker (clear all flags).
  setelemmarker(newtet->tet, 0);
  for (int i = 0; i < numelemattrib; i++) {
    setelemattribute(newtet->tet, i, 0.0);
  }
  if (b->varvolume) {
    setvolumebound(newtet->tet, -1.0);
  }

  // Initialize the version to be Zero.
  newtet->ver = 11;
}